

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptPromiseThunkFinallyFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseThunkFinallyFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,Var value,bool shouldThrow)

{
  Recycler *pRVar1;
  FunctionInfo *this_00;
  JavascriptPromiseThunkFinallyFunction *this_01;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_99;
  TrackAllocData local_98;
  DynamicType *local_70;
  DynamicType *type;
  undefined8 local_60;
  TrackAllocData local_58;
  FunctionInfo *local_30;
  FunctionInfo *functionInfo;
  Var pvStack_20;
  bool shouldThrow_local;
  Var value_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  functionInfo._7_1_ = shouldThrow;
  pvStack_20 = value;
  value_local = entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&FunctionInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1a25);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_58);
  type = (DynamicType *)Memory::Recycler::AllocInlined;
  local_60 = 0;
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
  FunctionInfo::FunctionInfo
            (this_00,(JavascriptMethod)value_local,ErrorOnNew,0xffffffff,(FunctionProxy *)0x0);
  local_30 = this_00;
  local_70 = CreateDeferredPrototypeFunctionType(this,(JavascriptMethod)value_local);
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_98,(type_info *)&JavascriptPromiseThunkFinallyFunction::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1a28);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_98);
  this_01 = (JavascriptPromiseThunkFinallyFunction *)
            new<(Memory::ObjectInfoBits)1>(0x50,pRVar1,&local_99);
  JavascriptPromiseThunkFinallyFunction::JavascriptPromiseThunkFinallyFunction
            (this_01,local_70,local_30,pvStack_20,(bool)(functionInfo._7_1_ & 1));
  return this_01;
}

Assistant:

JavascriptPromiseThunkFinallyFunction* JavascriptLibrary::CreatePromiseThunkFinallyFunction(JavascriptMethod entryPoint, Var value, bool shouldThrow)
    {
        FunctionInfo* functionInfo = RecyclerNew(this->GetRecycler(), FunctionInfo, entryPoint, FunctionInfo::Attributes::ErrorOnNew);
        DynamicType* type = CreateDeferredPrototypeFunctionType(entryPoint);

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseThunkFinallyFunction, type, functionInfo, value, shouldThrow);
    }